

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProduct.cpp
# Opt level: O0

void __thiscall
mnf::CartesianProduct::forceOnTxM_
          (CartesianProduct *this,RefVec *out,ConstRefVec *in,ConstRefVec *x)

{
  ulong uVar1;
  size_type sVar2;
  __shared_ptr_access<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  ConstSegment local_158;
  ConstRefVec local_120;
  DenseBase<Eigen::Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
  local_f8 [56];
  ConstRefVec local_c0;
  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_98;
  DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
  local_80 [56];
  RefVec local_48;
  ulong local_30;
  size_t i;
  ConstRefVec *x_local;
  ConstRefVec *in_local;
  RefVec *out_local;
  CartesianProduct *this_local;
  
  local_30 = 0;
  i = (size_t)x;
  x_local = in;
  in_local = (ConstRefVec *)out;
  out_local = (RefVec *)this;
  while( true ) {
    uVar1 = local_30;
    sVar2 = std::
            vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
            ::size(&this->subManifolds_);
    if (sVar2 <= uVar1) break;
    this_00 = (__shared_ptr_access<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::
              vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
              ::operator[](&this->subManifolds_,local_30);
    this_01 = std::
              __shared_ptr_access<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->(this_00);
    Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::Ref
              (&local_98,out);
    Manifold::getView<1>((Segment *)local_80,&this->super_Manifold,&local_98,local_30);
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
              ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)&local_48,local_80,
               (type *)0x0);
    Manifold::getConstView<1>((ConstSegment *)local_f8,&this->super_Manifold,x_local,local_30);
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>const,_1,1,false>>
              ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_c0,
               local_f8,(type *)0x0);
    Manifold::getConstView<0>(&local_158,&this->super_Manifold,(ConstRefVec *)i,local_30);
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>const,_1,1,false>>
              ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_120,
               (DenseBase<Eigen::Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                *)&local_158,(type *)0x0);
    Manifold::forceOnTxM(this_01,&local_48,&local_c0,&local_120);
    Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
              (&local_120);
    Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
              (&local_c0);
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

void CartesianProduct::forceOnTxM_(RefVec out, const ConstRefVec& in,
                                   const ConstRefVec& x) const
{
  for (size_t i = 0; i < subManifolds_.size(); ++i)
    subManifolds_[i]->forceOnTxM(getView<T>(out, i), getConstView<T>(in, i),
                                 getConstView<R>(x, i));
}